

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

bool __thiscall
r_exec::IPGMContext::evaluate_no_dereference(IPGMContext *this,uint16_t *result_index)

{
  byte bVar1;
  bool bVar2;
  uint16_t opcode;
  short sVar3;
  uint uVar4;
  int iVar5;
  IPGMContext *this_00;
  IPGMContext local_128;
  IPGMContext local_f8;
  uint16_t local_c6;
  ushort local_c4;
  ushort local_c2;
  undefined1 local_c0 [2];
  uint16_t unused_result_index_1;
  uint16_t i_1;
  uint16_t atom_count_1;
  Context _c;
  IPGMContext *__c;
  IPGMContext local_78;
  uint16_t local_46;
  ushort local_44;
  ushort local_42;
  undefined4 uStack_40;
  uint16_t unused_result_index;
  uint16_t i;
  uint16_t atom_count;
  undefined1 local_30 [8];
  Operator op;
  uint16_t *result_index_local;
  IPGMContext *this_local;
  
  switch((this->super__Context).data) {
  case REFERENCE:
  case VALUE_ARRAY:
    this_local._7_1_ = true;
    break;
  case VIEW:
  case MKS:
  case VWS:
    *result_index = (this->super__Context).index;
    this_local._7_1_ = true;
    break;
  default:
    op._overload = (_func_bool_Context_ptr_uint16_t_ptr *)result_index;
    bVar1 = r_code::Atom::getDescriptor();
    uVar4 = (uint)bVar1;
    if (1 < uVar4 - 0xc1) {
      if (uVar4 == 0xc3) {
        operator[](this,0);
        sVar3 = r_code::Atom::asOpcode();
        if (sVar3 != Opcodes::Ptn) {
          operator[](this,0);
          sVar3 = r_code::Atom::asOpcode();
          if (sVar3 != Opcodes::AntiPtn) {
            return false;
          }
        }
        *(uint16_t *)op._overload = (this->super__Context).index;
        return true;
      }
      if (uVar4 != 0xc4) {
        if (uVar4 == 0xc5) {
          operator[](this,0);
          opcode = r_code::Atom::asOpcode();
          Operator::Get((Operator *)local_30,opcode);
          bVar2 = Operator::is_syn((Operator *)local_30);
          if (bVar2) {
            this_local._7_1_ = true;
            uStack_40 = 1;
          }
          else {
            bVar2 = Operator::is_red((Operator *)local_30);
            if (!bVar2) {
              iVar5 = (*(this->super__Context)._vptr__Context[6])();
              local_42 = (ushort)iVar5;
              for (local_44 = 1; local_44 <= local_42; local_44 = local_44 + 1) {
                getChild((IPGMContext *)&__c,this,local_44);
                operator*(&local_78,(IPGMContext *)&__c);
                bVar2 = evaluate_no_dereference(&local_78,&local_46);
                ~IPGMContext(&local_78);
                ~IPGMContext((IPGMContext *)&__c);
                if (((bVar2 ^ 0xffU) & 1) != 0) {
                  this_local._7_1_ = false;
                  uStack_40 = 1;
                  goto LAB_002119f0;
                }
              }
            }
            this_00 = (IPGMContext *)operator_new(0x30);
            IPGMContext(this_00,this);
            _c.implementation = (_Context *)this_00;
            Context::Context((Context *)local_c0,(_Context *)this_00);
            this_local._7_1_ =
                 Operator::operator()
                           ((Operator *)local_30,(Context *)local_c0,(uint16_t *)op._overload);
            uStack_40 = 1;
            Context::~Context((Context *)local_c0);
          }
LAB_002119f0:
          Operator::~Operator((Operator *)local_30);
          return this_local._7_1_;
        }
        if (6 < uVar4 - 200) {
          *(uint16_t *)op._overload = (this->super__Context).index;
          return true;
        }
      }
    }
    iVar5 = (*(this->super__Context)._vptr__Context[6])();
    local_c2 = (ushort)iVar5;
    for (local_c4 = 1; local_c4 <= local_c2; local_c4 = local_c4 + 1) {
      getChild(&local_128,this,local_c4);
      operator*(&local_f8,&local_128);
      bVar2 = evaluate_no_dereference(&local_f8,&local_c6);
      ~IPGMContext(&local_f8);
      ~IPGMContext(&local_128);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        return false;
      }
    }
    *(uint16_t *)op._overload = (this->super__Context).index;
    this_local._7_1_ = true;
    break;
  case UNDEFINED:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool IPGMContext::evaluate_no_dereference(uint16_t &result_index) const
{
    switch (data) {
    case REFERENCE:
    case VALUE_ARRAY:
        return true;

    case UNDEFINED:
        return false;

    case VIEW:
    case MKS:
    case VWS:
        result_index = index;
        return true;
    }

    switch (code[index].getDescriptor()) {
    case Atom::OPERATOR: {
        Operator op = Operator::Get((*this)[0].asOpcode());

        if (op.is_syn()) {
            return true;
        }

        if (!op.is_red()) { // red will prevent the evaluation of its productions before reducting its input.
            uint16_t atom_count = getChildrenCount();

            for (uint16_t i = 1; i <= atom_count; ++i) {
                uint16_t unused_result_index;

                if (!(*getChild(i)).evaluate_no_dereference(unused_result_index)) {
                    return false;
                }
            }
        }

        IPGMContext *__c = new IPGMContext(*this);
        Context _c(__c);
        return op(_c, result_index);
    }

    case Atom::OBJECT: // incl. cmd.
        if ((*this)[0].asOpcode() == Opcodes::Ptn || (*this)[0].asOpcode() == Opcodes::AntiPtn) { // skip patterns.
            result_index = index;
            return true;
        }
        return false;

    case Atom::MARKER:
    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_CPP_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
    case Atom::COMPOSITE_STATE:
    case Atom::MODEL:
    case Atom::GROUP:
    case Atom::SET:
    case Atom::S_SET: {
        uint16_t atom_count = getChildrenCount();

        for (uint16_t i = 1; i <= atom_count; ++i) {
            uint16_t unused_result_index;

            if (!(*getChild(i)).evaluate_no_dereference(unused_result_index)) {
                return false;
            }
        }

        result_index = index;
        return true;
    }

    default:
        result_index = index;
        return true;
    }
}